

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O2

void __thiscall
RTree::get_polygons_JSON(RTree *this,vector<d_leaf_*,_std::allocator<d_leaf_*>_> *ans,string *json)

{
  ulong uVar1;
  ulong uVar2;
  _Vector_base<Point,_std::allocator<Point>_> local_68;
  string local_50;
  
  std::__cxx11::string::append((char *)json);
  uVar2 = 0;
LAB_00105a0c:
  if ((ulong)((long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) <= uVar2) {
    std::__cxx11::string::append((char *)json);
    return;
  }
  uVar1 = 0;
  do {
    std::__cxx11::string::append((char *)json);
    do {
      if ((long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar2]->polygon->corners <= (long)uVar1) {
        std::__cxx11::string::append((char *)json);
        uVar2 = uVar2 + 1;
        if ((long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3 != uVar2) {
          std::__cxx11::string::append((char *)json);
        }
        goto LAB_00105a0c;
      }
      std::__cxx11::string::append((char *)json);
      Polygon::get_vertices
                ((vector<Point,_std::allocator<Point>_> *)&local_68,
                 (ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar2]->polygon);
      std::__cxx11::to_string(&local_50,local_68._M_impl.super__Vector_impl_data._M_start[uVar1].X);
      std::__cxx11::string::append((string *)json);
      std::__cxx11::string::~string((string *)&local_50);
      std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base(&local_68);
      std::__cxx11::string::append((char *)json);
      Polygon::get_vertices
                ((vector<Point,_std::allocator<Point>_> *)&local_68,
                 (ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar2]->polygon);
      std::__cxx11::to_string(&local_50,local_68._M_impl.super__Vector_impl_data._M_start[uVar1].Y);
      std::__cxx11::string::append((string *)json);
      std::__cxx11::string::~string((string *)&local_50);
      std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base(&local_68);
      std::__cxx11::string::append((char *)json);
      uVar1 = uVar1 + 1;
    } while (uVar1 == (uint)(ans->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar2]->polygon->corners);
  } while( true );
}

Assistant:

void RTree::get_polygons_JSON(const std::vector<d_leaf*> & ans,std::string &json){
    json += "[";
    for(int i=0; i<ans.size(); i++){
        json +="[";    
        for(int j = 0; j < ans[i]->polygon->corners;j++){
           json +="[";
           json += std::to_string(ans[i]->polygon->get_vertices()[j].get_X());
           json += ",";
           json += std::to_string(ans[i]->polygon->get_vertices()[j].get_Y()); 
           json +="]";
           if((j+1) != ans[i]->polygon->corners)
                json +=",";
        }
        json +="]";
        if((i+1) != ans.size())
            json +=",";
    }
    json += "]";
}